

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O2

HelicsFilter
helicsFederateRegisterFilter(HelicsFederate fed,HelicsFilterTypes type,char *name,HelicsError *err)

{
  Filter *pFVar1;
  HelicsFilter pvVar2;
  char *in_R8;
  string_view name_00;
  __single_object filt;
  shared_ptr<helics::Federate> fedObj;
  allocator<char> local_69;
  _Head_base<0UL,_helics::FilterObject_*,_false> local_68;
  __uniq_ptr_impl<helics::FilterObject,_std::default_delete<helics::FilterObject>_> local_60;
  __shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2> local_58;
  size_t local_48;
  Federate *local_40;
  
  getFedSharedPtr(&local_58,(HelicsError *)fed);
  if (local_58._M_ptr == (element_type *)0x0) {
    pvVar2 = (HelicsFilter)0x0;
  }
  else {
    std::make_unique<helics::FilterObject>();
    if (name == (char *)0x0) {
      std::__cxx11::string::string((string *)&local_48,&gHelicsEmptyStr_abi_cxx11_);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,name,&local_69);
    }
    name_00._M_str = in_R8;
    name_00._M_len = local_48;
    pFVar1 = helics::make_filter((helics *)(ulong)type,(FilterTypes)local_58._M_ptr,local_40,name_00
                                );
    (local_68._M_head_impl)->filtPtr = pFVar1;
    std::__cxx11::string::~string((string *)&local_48);
    std::__shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&((local_68._M_head_impl)->fedptr).
                super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>,&local_58);
    (local_68._M_head_impl)->custom = type == HELICS_FILTER_TYPE_CUSTOM;
    local_60._M_t.
    super__Tuple_impl<0UL,_helics::FilterObject_*,_std::default_delete<helics::FilterObject>_>.
    super__Head_base<0UL,_helics::FilterObject_*,_false>._M_head_impl =
         (tuple<helics::FilterObject_*,_std::default_delete<helics::FilterObject>_>)
         (tuple<helics::FilterObject_*,_std::default_delete<helics::FilterObject>_>)
         local_68._M_head_impl;
    local_68._M_head_impl = (FilterObject *)0x0;
    pvVar2 = anon_unknown.dwarf_a089a::federateAddFilter
                       (fed,(unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>
                             *)&local_60);
    std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::~unique_ptr
              ((unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *)
               &local_60);
    std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::~unique_ptr
              ((unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *)
               &local_68);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  return pvVar2;
}

Assistant:

HelicsFilter helicsFederateRegisterFilter(HelicsFederate fed, HelicsFilterTypes type, const char* name, HelicsError* err)
{
    // now generate a generic subscription
    auto fedObj = getFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }

    try {
        auto filt = std::make_unique<helics::FilterObject>();
        filt->filtPtr = &helics::make_filter(static_cast<helics::FilterTypes>(type), fedObj.get(), AS_STRING(name));
        filt->fedptr = std::move(fedObj);
        filt->custom = (type == HELICS_FILTER_TYPE_CUSTOM);
        return federateAddFilter(fed, std::move(filt));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
    return nullptr;
}